

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O0

void __thiscall
asio::detail::epoll_reactor::
schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,time_type *time,per_timer_data *timer,wait_op *op)

{
  epoll_reactor *in_RCX;
  conditionally_enabled_mutex *in_RDI;
  bool earliest;
  scoped_lock lock;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  operation *in_stack_ffffffffffffffc8;
  scheduler *in_stack_ffffffffffffffd0;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock
            ((scoped_lock *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_RDI);
  if ((in_RDI[2].mutex_.mutex_.__size[0x10] & 1U) == 0) {
    in_stack_ffffffffffffffa7 =
         timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
         ::enqueue_timer((timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                          *)in_stack_ffffffffffffffd0,(time_type *)in_stack_ffffffffffffffc8,
                         (per_timer_data *)
                         CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                         (wait_op *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar1 = in_stack_ffffffffffffffa7;
    scheduler::work_started((scheduler *)0x194ec6);
    if ((bVar1 & 1) != 0) {
      update_timeout(in_RCX);
    }
  }
  else {
    scheduler::post_immediate_completion
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
  }
  conditionally_enabled_mutex::scoped_lock::~scoped_lock
            ((scoped_lock *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void epoll_reactor::schedule_timer(timer_queue<Time_Traits>& queue,
    const typename Time_Traits::time_type& time,
    typename timer_queue<Time_Traits>::per_timer_data& timer, wait_op* op)
{
  mutex::scoped_lock lock(mutex_);

  if (shutdown_)
  {
    scheduler_.post_immediate_completion(op, false);
    return;
  }

  bool earliest = queue.enqueue_timer(time, timer, op);
  scheduler_.work_started();
  if (earliest)
    update_timeout();
}